

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O2

bool __thiscall
QLocalSocket::setSocketDescriptor
          (QLocalSocket *this,qintptr socketDescriptor,LocalSocketState socketState,
          OpenMode openMode)

{
  QLocalSocketPrivate *this_00;
  bool bVar1;
  SocketState socketState_00;
  
  this_00 = *(QLocalSocketPrivate **)&this->field_0x8;
  socketState_00 = UnconnectedState;
  if (socketState - ConnectingState < 5) {
    socketState_00 = *(SocketState *)(&DAT_00261c38 + (ulong)(socketState - ConnectingState) * 4);
  }
  QIODevice::open(this,openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  this_00->state = socketState;
  QLocalSocketPrivate::describeSocket(this_00,socketDescriptor);
  bVar1 = QAbstractSocket::setSocketDescriptor
                    ((QAbstractSocket *)&this_00->unixSocket,socketDescriptor,socketState_00,
                     openMode);
  return bVar1;
}

Assistant:

bool QLocalSocket::setSocketDescriptor(qintptr socketDescriptor,
        LocalSocketState socketState, OpenMode openMode)
{
    Q_D(QLocalSocket);
    QAbstractSocket::SocketState newSocketState = QAbstractSocket::UnconnectedState;
    switch (socketState) {
    case ConnectingState:
        newSocketState = QAbstractSocket::ConnectingState;
        break;
    case ConnectedState:
        newSocketState = QAbstractSocket::ConnectedState;
        break;
    case ClosingState:
        newSocketState = QAbstractSocket::ClosingState;
        break;
    case UnconnectedState:
        newSocketState = QAbstractSocket::UnconnectedState;
        break;
    }
    QIODevice::open(openMode);
    d->state = socketState;
    d->describeSocket(socketDescriptor);
    return d->unixSocket.setSocketDescriptor(socketDescriptor,
                                             newSocketState, openMode);
}